

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O0

void __thiscall leveldb::Options::Options(Options *this)

{
  long lVar1;
  Comparator *pCVar2;
  Env *pEVar3;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = BytewiseComparator();
  *in_RDI = pCVar2;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  *(undefined1 *)((long)in_RDI + 10) = 0;
  pEVar3 = Env::Default();
  in_RDI[2] = pEVar3;
  in_RDI[3] = 0;
  in_RDI[4] = 0x400000;
  *(undefined4 *)(in_RDI + 5) = 1000;
  in_RDI[6] = 0;
  in_RDI[7] = 0x1000;
  *(undefined4 *)(in_RDI + 8) = 0x10;
  in_RDI[9] = 0x200000;
  *(undefined4 *)(in_RDI + 10) = 1;
  *(undefined1 *)((long)in_RDI + 0x54) = 0;
  in_RDI[0xb] = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Options::Options() : comparator(BytewiseComparator()), env(Env::Default()) {}